

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  undefined8 *puVar1;
  __pid_t _Var2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  int status_value;
  int local_13c;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string local_f8;
  int local_d4;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((this->super_DeathTestImpl).spawned_ != true) {
    return 0;
  }
  DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
  do {
    _Var2 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,&local_13c,0);
    if (_Var2 != -1) {
      (this->super_DeathTestImpl).status_ = local_13c;
      return local_13c;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_118 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_118 == puVar7) {
    local_108 = *puVar7;
    lStack_100 = plVar4[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar7;
  }
  local_110 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d4 = 0x331;
  StreamableToString<int>(&local_f8,&local_d4);
  uVar9 = 0xf;
  if (local_118 != &local_108) {
    uVar9 = local_108;
  }
  if (uVar9 < local_f8._M_string_length + local_110) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar10 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_110 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
      goto LAB_00147504;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
LAB_00147504:
  local_138 = (undefined8 *)*puVar5;
  puVar1 = puVar5 + 2;
  if (local_138 == puVar1) {
    local_128 = *puVar1;
    uStack_120 = puVar5[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar1;
  }
  local_130 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_70 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_d0 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}